

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAddRgEa<(moira::Instr)1,(moira::Mode)6,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  Ea<(moira::Mode)6,_2> dst;
  Ea<(moira::Mode)6,_2> local_24;
  
  Op<(moira::Mode)6,2>(&local_24,this,op & 7,addr);
  cVar5 = 'a';
  lVar3 = 1;
  do {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar5;
    cVar5 = "fdadd"[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  pcVar4 = str->ptr;
  SVar1 = str->style->syntax;
  str->ptr = pcVar4 + 1;
  if (2 < SVar1 - MOIRA_MIT) {
    *pcVar4 = '.';
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
  }
  *pcVar4 = 'w';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    pcVar4 = str->ptr;
    do {
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
      pcVar4 = str->ptr;
    } while (pcVar4 < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Dn)(op >> 9 & 7));
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str,&local_24);
  return;
}

Assistant:

void
Moira::dasmAddRgEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}